

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileIO.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_binary_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                string *filename)

{
  FILE *__stream;
  size_type __new_size;
  size_t sVar1;
  runtime_error *prVar2;
  long *plVar3;
  long *plVar4;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,"File ",filename);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_68 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_68 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar2,(string *)&local_68);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fseek(__stream,0,2);
  __new_size = ftell(__stream);
  rewind(__stream);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,__new_size);
  sVar1 = fread((__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,__new_size,1,__stream);
  if (sVar1 == 1) {
    return __return_storage_ptr__;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"File ",filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_68 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_68 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar2,(string *)&local_68);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<uint8_t> read_binary_file(const std::string& filename) {
  auto fp = fopen(filename.c_str(), "rb");
  if(!fp) throw std::runtime_error("File " + filename + " cannot be opened");
  fseek(fp, 0, SEEK_END);
  auto len = ftell(fp);
  rewind(fp);

  std::vector<uint8_t> data;
  data.resize(len);

  if(fread(data.data(), len, 1, fp) != 1) {
    throw std::runtime_error("File " + filename + " cannot be read");
  }

  return data;
}